

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeRegisterClass(MCInst *Inst,uint64_t RegNo,uint *Regs)

{
  uint *Regs_local;
  uint64_t RegNo_local;
  MCInst *Inst_local;
  
  if (Regs[RegNo] == 0) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    MCOperand_CreateReg0(Inst,Regs[RegNo]);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus decodeRegisterClass(MCInst *Inst, uint64_t RegNo, const unsigned *Regs)
{
	//assert(RegNo < 16 && "Invalid register");
	RegNo = Regs[RegNo];
	if (RegNo == 0)
		return MCDisassembler_Fail;

	MCOperand_CreateReg0(Inst, (unsigned)RegNo);
	return MCDisassembler_Success;
}